

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O1

bool __thiscall GrcManager::StorePseudoToActualAsGlyphAttr(GrcManager *this)

{
  uint uVar1;
  GrcSymbolTable *this_00;
  GdlRenderer *pGVar2;
  GrcGlyphAttrMatrix *pGVar3;
  Symbol pGVar4;
  pointer ppGVar5;
  ulong uVar6;
  string local_48;
  
  this_00 = this->m_psymtbl;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"*actualForPseudo*","");
  pGVar4 = GrcSymbolTable::FindSymbol(this_00,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pGVar2 = this->m_prndr;
  ppGVar5 = (pGVar2->m_vpglfc).
            super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((pGVar2->m_vpglfc).
      super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppGVar5) {
    uVar1 = pGVar4->m_nInternalID;
    pGVar3 = this->m_pgax;
    uVar6 = 0;
    do {
      (*(ppGVar5[uVar6]->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn[0xc])
                (ppGVar5[uVar6],pGVar3,(ulong)uVar1,&this->m_vpexpModified);
      uVar6 = uVar6 + 1;
      ppGVar5 = (pGVar2->m_vpglfc).
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(pGVar2->m_vpglfc).
                                   super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar5 >> 3))
    ;
  }
  return true;
}

Assistant:

bool GrcManager::StorePseudoToActualAsGlyphAttr()
{
	Symbol psym = m_psymtbl->FindSymbol("*actualForPseudo*");
	Assert(psym);
	int nAttrID = psym->InternalID();

	m_prndr->StorePseudoToActualAsGlyphAttr(m_pgax, nAttrID, m_vpexpModified);

	return true;
}